

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::DirectoryContentsTask::start
          (DirectoryContentsTask *this,TaskInterface ti)

{
  StringRef str;
  BuildKey local_68;
  long *local_48 [2];
  long local_38 [2];
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  str.Data = (this->path)._M_dataplus._M_p;
  str.Length = (this->path)._M_string_length;
  llbuild::buildsystem::BuildKey::BuildKey(&local_68,'N',str);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,local_68.key.key._M_dataplus._M_p,
             local_68.key.key._M_dataplus._M_p + local_68.key.key._M_string_length);
  llbuild::core::TaskInterface::request(&local_28,(KeyType *)local_48,0);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.key.key._M_dataplus._M_p != &local_68.key.key.field_2) {
    operator_delete(local_68.key.key._M_dataplus._M_p,
                    local_68.key.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the base directory node -- this task doesn't actually use the
    // value, but this connects the task to its producer if present.

    // FIXME:
    //
    //engine.taskMustFollow(this, BuildKey::makeNode(path).toData());
    //
    // The taskMustFollow method expresses the weak dependency we have on
    // 'path', but only at the task level. What we really want is to say at the
    // 'isResultValid'/scanning level is 'must scan after'. That way we hold up
    // this and downstream rules until the 'path' node has been set into its
    // final state*.
    //
    // With the explicit dependency we are establishing with request(), we
    // will unfortunately mark directory contents as 'needs to be built' under
    // situations where non-releveant stat info has changed. This causes
    // unnecessary rebuilds. See rdar://problem/30640904
    //
    // * The 'final state' of a directory is also a thorny patch of toxic land
    // mines. We really want directory contents to weakly depend upon anything
    // that is currently and/or may be altered within it. i.e. if one rule
    // creates the directory and another rule writes a file into it, we want to
    // defer scanning until both of them have been scanned and possibly run.
    // Having a 'must scan after' would help with the first rule (mkdir), but
    // not the second, in particular if rules are added in subsequent builds.
    // Related rdar://problem/30638921
    //
    ti.request(BuildKey::makeNode(path).toData(), /*inputID=*/0);
  }